

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 * COVER_map_at(COVER_map_t *map,U32 key)

{
  COVER_map_pair_t *pCVar1;
  U32 UVar2;
  U32 *pUVar3;
  
  pCVar1 = map->data;
  UVar2 = COVER_map_index(map,key);
  pUVar3 = &pCVar1[UVar2].value;
  if (*pUVar3 == 0xffffffff) {
    pCVar1 = pCVar1 + UVar2;
    pCVar1->key = key;
    pCVar1->value = 0;
  }
  return pUVar3;
}

Assistant:

static U32 *COVER_map_at(COVER_map_t *map, U32 key) {
  COVER_map_pair_t *pos = &map->data[COVER_map_index(map, key)];
  if (pos->value == MAP_EMPTY_VALUE) {
    pos->key = key;
    pos->value = 0;
  }
  return &pos->value;
}